

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marry.c
# Opt level: O1

void nuts_scratch_addr_zero(char *scheme,size_t sz,char *addr)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  char *pcVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar9;
  ulong uVar10;
  undefined8 local_38;
  
  iVar1 = strcmp(scheme,"inproc");
  if ((iVar1 == 0) || (iVar1 = strcmp(scheme,"abstract"), iVar1 == 0)) {
    uVar2 = nng_random();
    uVar3 = nng_random();
    uVar6 = nng_random();
    uVar7 = nng_random();
    snprintf(addr,sz,"%s://nuts%04x%04x%04x%04x",scheme,uVar2,(ulong)uVar3,(ulong)uVar6,(ulong)uVar7
            );
  }
  else {
    iVar1 = strncmp(scheme,"tcp",3);
    if ((iVar1 == 0) ||
       ((iVar1 = strncmp(scheme,"tls",3), iVar1 == 0 ||
        (iVar1 = strncmp(scheme,"udp",3), iVar1 == 0)))) {
      pcVar8 = strchr(scheme,0x36);
      pcVar9 = "[::1]";
      if (pcVar8 == (char *)0x0) {
        pcVar9 = "127.0.0.1";
      }
      snprintf(addr,sz,"%s://%s:%u",scheme,pcVar9,0);
      return;
    }
    iVar1 = strncmp(scheme,"ws",2);
    if (iVar1 == 0) {
      pcVar9 = strchr(scheme,0x36);
      pcVar8 = "[::1]";
      if (pcVar9 == (char *)0x0) {
        pcVar8 = "127.0.0.1";
      }
      uVar2 = nng_random();
      local_38 = CONCAT44(extraout_var_00,uVar2);
      uVar4 = nng_random();
      uVar5 = nng_random();
      nng_random();
      pcVar9 = "%s://%s:%u/nuts%04x%04x%04x%04x";
      uVar10 = 0;
    }
    else {
      iVar1 = strncmp(scheme,"ipc",3);
      if ((iVar1 != 0) && (iVar1 = strncmp(scheme,"unix",4), iVar1 != 0)) {
        nng_log_err("NUTS","Unknown scheme");
        abort();
      }
      pcVar8 = getenv("TMPDIR");
      if ((pcVar8 == (char *)0x0) && (pcVar8 = getenv("TEMP"), pcVar8 == (char *)0x0)) {
        pcVar9 = getenv("TMP");
        pcVar8 = "/tmp";
        if (pcVar9 != (char *)0x0) {
          pcVar8 = pcVar9;
        }
      }
      uVar2 = nng_random();
      uVar3 = nng_random();
      local_38 = CONCAT44(extraout_var,uVar3);
      uVar4 = nng_random();
      uVar5 = nng_random();
      pcVar9 = "%s://%s/nuts%04x%04x%04x%04x";
      uVar10 = (ulong)uVar2;
    }
    snprintf(addr,sz,pcVar9,scheme,pcVar8,uVar10,local_38,(ulong)uVar4,(ulong)uVar5);
  }
  return;
}

Assistant:

void
nuts_scratch_addr_zero(const char *scheme, size_t sz, char *addr)
{
	if ((strcmp(scheme, "inproc") == 0) ||
	    (strcmp(scheme, "abstract") == 0)) {
		(void) snprintf(addr, sz, "%s://nuts%04x%04x%04x%04x", scheme,
		    nng_random(), nng_random(), nng_random(), nng_random());
		return;
	}

	if ((strncmp(scheme, "tcp", 3) == 0) ||
	    (strncmp(scheme, "tls", 3) == 0) ||
	    (strncmp(scheme, "udp", 3) == 0)) {
		const char *ip =
		    strchr(scheme, '6') != NULL ? "[::1]" : "127.0.0.1";
		(void) snprintf(addr, sz, "%s://%s:%u", scheme, ip, 0);
		return;
	}

	if (strncmp(scheme, "ws", 2) == 0) {
		const char *ip =
		    strchr(scheme, '6') != NULL ? "[::1]" : "127.0.0.1";
		(void) snprintf(addr, sz, "%s://%s:%u/nuts%04x%04x%04x%04x",
		    scheme, ip, 0, nng_random(), nng_random(), nng_random(),
		    nng_random());
		return;
	}

	if ((strncmp(scheme, "ipc", 3) == 0) ||
	    (strncmp(scheme, "unix", 4) == 0)) {
#ifdef _WIN32
		// Windows doesn't place IPC names in the filesystem.
		(void) snprintf(addr, sz, "%s://nuts%04x%04x%04x%04x", scheme,
		    nng_random(), nng_random(), nng_random(), nng_random());
		return;
#else
		char *tmpdir;

		if (((tmpdir = getenv("TMPDIR")) == NULL) &&
		    ((tmpdir = getenv("TEMP")) == NULL) &&
		    ((tmpdir = getenv("TMP")) == NULL)) {
			tmpdir = "/tmp";
		}

		(void) snprintf(addr, sz, "%s://%s/nuts%04x%04x%04x%04x",
		    scheme, tmpdir, nng_random(), nng_random(), nng_random(),
		    nng_random());
		return;
#endif
	}

	// We should not be here.
	nng_log_err("NUTS", "Unknown scheme");
	abort();
}